

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

double GetGravity(ELLIPSOID type,BLH blh)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double in_stack_00000008;
  double in_stack_00000010;
  double in_stack_00000020;
  double in_stack_00000038;
  double in_stack_00000040;
  double in_stack_00000048;
  double in_stack_00000050;
  
  dVar1 = cos(in_stack_00000050);
  dVar2 = cos(in_stack_00000050);
  dVar3 = sin(in_stack_00000050);
  dVar4 = sin(in_stack_00000050);
  dVar5 = cos(in_stack_00000050);
  dVar6 = cos(in_stack_00000050);
  dVar7 = sin(in_stack_00000050);
  dVar8 = sin(in_stack_00000050);
  dVar5 = dVar6 * dVar5 * in_stack_00000008 * in_stack_00000008 +
          dVar8 * dVar7 * in_stack_00000010 * in_stack_00000010;
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  dVar6 = sin(in_stack_00000050);
  dVar7 = sin(in_stack_00000050);
  return ((dVar7 * in_stack_00000020 * -2.0 * dVar6 +
          (in_stack_00000008 * 5.3174941173225e-09 * in_stack_00000008 * in_stack_00000010) /
          in_stack_00000048 + in_stack_00000020 + 1.0) * (-2.0 / in_stack_00000008) * type.a + 1.0 +
         (3.0 / (in_stack_00000008 * in_stack_00000008)) * type.a * type.a) *
         ((dVar2 * dVar1 * in_stack_00000038 * in_stack_00000008 +
          dVar4 * dVar3 * in_stack_00000040 * in_stack_00000010) / dVar5);
}

Assistant:

double GetGravity(ELLIPSOID type, BLH blh) {
    double m = OMEGA * OMEGA * type.a * type.a * type.b / type.GM;

    double up_phi = type.a * type.gama_a * cos(blh.B) * cos(blh.B) +
                    type.b * type.gama_b * sin(blh.B) * sin(blh.B);
    double down_phi = sqrt(type.a * type.a * cos(blh.B) * cos(blh.B) + 
                           type.b * type.b * sin(blh.B) * sin(blh.B));
    double phi = up_phi / down_phi;

    double right = 1.0 - 2.0 / type.a * 
                   (1.0 + type.alpha + m - 2.0 * type.alpha * sin(blh.B) * sin(blh.B)) *
                   blh.H + 3.0 / (type.a * type.a) * blh.H * blh.H;
    
    return (phi * right);     
}